

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

void __thiscall CVmDateLocale::CVmDateLocale(CVmDateLocale *this)

{
  long lVar1;
  vm_obj_id_t vVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  CVmObjVector *pCVar6;
  
  CVmMetaclass::get_class_obj(CVmObjDate::metaclass_reg_);
  vVar2 = CVmMetaclass::get_class_obj(CVmObjDate::metaclass_reg_);
  (**(code **)(*(long *)&G_obj_table_X.pages_[vVar2 >> 0xc][vVar2 & 0xfff].ptr_ + 8))
            (G_obj_table_X.pages_[vVar2 >> 0xc] + (vVar2 & 0xfff),CVmObjClass::metaclass_reg_);
  vVar2 = CVmMetaclass::get_class_obj(CVmObjDate::metaclass_reg_);
  lVar1 = *(long *)((long)&G_obj_table_X.pages_[vVar2 >> 0xc][vVar2 & 0xfff].ptr_ + 8);
  uVar5 = 0;
  if (*(int *)(lVar1 + 8) == 5) {
    uVar5 = (ulong)*(uint *)(lVar1 + 0x10);
  }
  uVar3 = (uint)uVar5;
  this->vecid = uVar3;
  if (uVar3 != 0) {
    iVar4 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar5 >> 0xc][uVar3 & 0xfff].ptr_ + 8))
                      (G_obj_table_X.pages_[uVar5 >> 0xc] + (uVar3 & 0xfff),
                       CVmObjVector::metaclass_reg_);
    if (iVar4 != 0) {
      pCVar6 = (CVmObjVector *)
               ((G_obj_table_X.pages_[this->vecid >> 0xc]->ptr_).obj_ + (this->vecid & 0xfff) * 0x18
               );
      goto LAB_00290e56;
    }
  }
  pCVar6 = (CVmObjVector *)0x0;
LAB_00290e56:
  this->vec = pCVar6;
  return;
}

Assistant:

CVmDateLocale(VMG0_)
    {
        /* get the state Vector from the Date static class state holder */
        const vm_val_t *val = vm_classobj_for(CVmObjDate)->get_class_state();
        vecid = val->typ == VM_OBJ ? val->val.obj : VM_INVALID_OBJ;
        vec = vm_objid_cast(CVmObjVector, vecid);
    }